

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O1

void Fxu_UpdateCleanOldSingles(Fxu_Matrix *p)

{
  int iVar1;
  Fxu_Single *pSingle;
  Fxu_Single *pFVar2;
  
  pSingle = (p->lSingles).pHead;
  if (pSingle != (Fxu_Single *)0x0) {
    pFVar2 = pSingle->pNext;
    while( true ) {
      if ((pSingle->pVar1->pOrder != (Fxu_Var *)0x0) || (pSingle->pVar2->pOrder != (Fxu_Var *)0x0))
      {
        iVar1 = Fxu_SingleCountCoincidence(p,pSingle->pVar1,pSingle->pVar2);
        if (iVar1 < 2) {
          Fxu_HeapSingleDelete(p->pHeapSingle,pSingle);
          Fxu_ListMatrixDelSingle(p,pSingle);
          Fxu_MemRecycle(p,(char *)pSingle,0x30);
        }
        else {
          pSingle->Weight = iVar1 + -2;
          Fxu_HeapSingleUpdate(p->pHeapSingle,pSingle);
        }
      }
      if (pFVar2 == (Fxu_Single *)0x0) break;
      pSingle = pFVar2;
      pFVar2 = pFVar2->pNext;
    }
  }
  return;
}

Assistant:

void Fxu_UpdateCleanOldSingles( Fxu_Matrix * p )
{ 
    Fxu_Single * pSingle, * pSingle2;
    int WeightNew;
    int Counter = 0;

    Fxu_MatrixForEachSingleSafe( p, pSingle, pSingle2 )
    {
        // if at least one of the variables is marked, recalculate
        if ( pSingle->pVar1->pOrder || pSingle->pVar2->pOrder )
        {
            Counter++;
            // get the new weight
            WeightNew = -2 + Fxu_SingleCountCoincidence( p, pSingle->pVar1, pSingle->pVar2 );
            if ( WeightNew >= 0 )
            {
                pSingle->Weight = WeightNew;
                Fxu_HeapSingleUpdate( p->pHeapSingle, pSingle );
            }
            else
            {
                Fxu_HeapSingleDelete( p->pHeapSingle, pSingle );
                Fxu_ListMatrixDelSingle( p, pSingle );
		        MEM_FREE_FXU( p, Fxu_Single, 1, pSingle );
            }
        }
    }
//    printf( "Called procedure %d times.\n", Counter );
}